

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IR.cpp
# Opt level: O3

Opnd * __thiscall IR::Instr::FindCallArgumentOpnd(Instr *this,ArgSlot argSlot,Instr **ownerInstrRef)

{
  StackSym *this_00;
  code *pcVar1;
  bool bVar2;
  OpndKind OVar3;
  ArgSlot AVar4;
  uint uVar5;
  undefined4 *puVar6;
  Opnd *pOVar7;
  
  bVar2 = OpCodeAttr::CallInstr(this->m_opcode);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.cpp"
                       ,0x543,"(OpCodeAttr::CallInstr(m_opcode))","OpCodeAttr::CallInstr(m_opcode)")
    ;
    if (!bVar2) goto LAB_004b55bf;
    *puVar6 = 0;
  }
  if (argSlot == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.cpp"
                       ,0x544,"(argSlot != static_cast<Js::ArgSlot>(0))",
                       "argSlot != static_cast<Js::ArgSlot>(0)");
    if (!bVar2) goto LAB_004b55bf;
    *puVar6 = 0;
  }
  pOVar7 = this->m_src2;
  if (pOVar7 == (Opnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.cpp"
                       ,0x547,"(argInstr->GetSrc2())","argInstr->GetSrc2()");
    if (!bVar2) goto LAB_004b55bf;
    *puVar6 = 0;
    pOVar7 = this->m_src2;
  }
  OVar3 = Opnd::GetKind(pOVar7);
  if (OVar3 == OpndKindSym) {
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
  }
  else {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.cpp"
                       ,0x548,"(argInstr->GetSrc2()->IsSymOpnd())",
                       "argInstr->GetSrc2()->IsSymOpnd()");
    if (!bVar2) {
LAB_004b55bf:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar6 = 0;
  }
  do {
    pOVar7 = this->m_src2;
    OVar3 = Opnd::GetKind(pOVar7);
    if (OVar3 != OpndKindSym) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar6 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x45,"(this->IsSymOpnd())","Bad call to AsSymOpnd()");
      if (!bVar2) goto LAB_004b55bf;
      *puVar6 = 0;
    }
    this_00 = (StackSym *)pOVar7[1]._vptr_Opnd;
    if ((this_00->super_Sym).m_kind != SymKindStack) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar6 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Sym.inl"
                         ,0x1f,"(this->IsStackSym())","Bad call to AsStackSym()");
      if (!bVar2) goto LAB_004b55bf;
      *puVar6 = 0;
    }
    uVar5 = *(uint *)&this_00->field_0x18;
    if (((uVar5 & 1) == 0) || ((this_00->field_5).m_instrDef == (Instr *)0x0)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar6 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.cpp"
                         ,0x54c,"(linkSym->IsSingleDef())","linkSym->IsSingleDef()");
      if (!bVar2) goto LAB_004b55bf;
      *puVar6 = 0;
      uVar5 = *(uint *)&this_00->field_0x18;
    }
    uVar5 = uVar5 & 0x100000;
    if ((uVar5 != 0) && (*(short *)&(this_00->super_Sym).field_0x16 == 0)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar6 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Sym.inl"
                         ,0x5b,"(this->m_slotNum != 0)","this->m_slotNum != 0");
      if (!bVar2) goto LAB_004b55bf;
      *puVar6 = 0;
      uVar5 = *(uint *)&this_00->field_0x18 & 0x100000;
    }
    if (uVar5 == 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar6 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.cpp"
                         ,0x54d,"(linkSym->IsArgSlotSym())","linkSym->IsArgSlotSym()");
      if (!bVar2) goto LAB_004b55bf;
      *puVar6 = 0;
    }
    this = (this_00->field_5).m_instrDef;
    if (this->m_src2 == (Opnd *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar6 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.cpp"
                         ,0x550,"(argInstr->GetSrc2())","argInstr->GetSrc2()");
      if (!bVar2) goto LAB_004b55bf;
      *puVar6 = 0;
    }
    if ((this->m_opcode != ArgOut_A_InlineSpecialized) &&
       (AVar4 = StackSym::GetArgSlotNum(this_00), AVar4 == argSlot)) {
      if (ownerInstrRef != (Instr **)0x0) {
        *ownerInstrRef = this;
      }
      return this->m_src1;
    }
    OVar3 = Opnd::GetKind(this->m_src2);
    if (OVar3 != OpndKindSym) {
      return (Opnd *)0x0;
    }
  } while( true );
}

Assistant:

Opnd *Instr::FindCallArgumentOpnd(const Js::ArgSlot argSlot, IR::Instr * *const ownerInstrRef)
{
    Assert(OpCodeAttr::CallInstr(m_opcode));
    Assert(argSlot != static_cast<Js::ArgSlot>(0));

    IR::Instr *argInstr = this;
    Assert(argInstr->GetSrc2());
    Assert(argInstr->GetSrc2()->IsSymOpnd());
    do
    {
        StackSym *const linkSym = argInstr->GetSrc2()->AsSymOpnd()->m_sym->AsStackSym();
        Assert(linkSym->IsSingleDef());
        Assert(linkSym->IsArgSlotSym());

        argInstr = linkSym->m_instrDef;
        Assert(argInstr->GetSrc2());
        if(argInstr->m_opcode == Js::OpCode::ArgOut_A_InlineSpecialized)
        {
            // This is a fake ArgOut, skip it
            continue;
        }

        if(linkSym->GetArgSlotNum() == argSlot)
        {
            if(ownerInstrRef)
            {
                *ownerInstrRef = argInstr;
            }
            return argInstr->GetSrc1();
        }
    } while(argInstr->GetSrc2()->IsSymOpnd());
    return nullptr;
}